

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O3

unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
 __thiscall
pstore::index::details::linear_node::allocate_from
          (linear_node *this,database *db,index_pointer node,size_t extra_children)

{
  pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
  p;
  pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
  local_30;
  
  get_node(&local_30,db,node);
  if (local_30.second != (linear_node *)0x0) {
    allocate(this,extra_children + (local_30.second)->size_,local_30.second);
    if (local_30.first.
        super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.first.
                 super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    return (__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
            )(__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
              )this;
  }
  assert_failed("p.second != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                ,0x72);
}

Assistant:

std::unique_ptr<linear_node>
            linear_node::allocate_from (database const & db, index_pointer const node,
                                        std::size_t const extra_children) {
                std::pair<std::shared_ptr<linear_node const>, linear_node const *> const p =
                    linear_node::get_node (db, node);
                PSTORE_ASSERT (p.second != nullptr);
                return linear_node::allocate_from (*p.second, extra_children);
            }